

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void disas_crypto_two_reg_sha512(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *pTVar1;
  uint uVar2;
  ulong uVar3;
  TCGTemp *pTVar4;
  code *pcVar5;
  uintptr_t o;
  TCGv_i64 ret;
  uintptr_t o_1;
  TCGv_i64 ret_00;
  
  s_00 = s->uc->tcg_ctx;
  uVar2 = insn >> 10 & 3;
  if (uVar2 == 0) {
    pcVar5 = gen_helper_crypto_sha512su0;
    uVar3 = 0xe000;
  }
  else {
    if (uVar2 != 1) goto LAB_006b17a3;
    pcVar5 = gen_helper_crypto_sm4e;
    uVar3 = 0xf0000000000;
  }
  if ((s->isar->id_aa64isar0 & uVar3) != 0) {
    if (s->fp_access_checked == true) {
      __assert_fail("!s->fp_access_checked",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                    ,0x487,"_Bool fp_access_check(DisasContext *)");
    }
    s->fp_access_checked = true;
    if (s->fp_excp_el != 0) {
      gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
      return;
    }
    pTVar1 = s->uc->tcg_ctx;
    pTVar4 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
    ret = (TCGv_i64)((long)pTVar4 - (long)pTVar1);
    tcg_gen_addi_i64_aarch64
              (pTVar1,ret,(TCGv_i64)pTVar1->cpu_env,(ulong)((insn & 0x1f) * 0x100 + 0xc10));
    pTVar1 = s->uc->tcg_ctx;
    pTVar4 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
    ret_00 = (TCGv_i64)((long)pTVar4 - (long)pTVar1);
    tcg_gen_addi_i64_aarch64
              (pTVar1,ret_00,(TCGv_i64)pTVar1->cpu_env,(ulong)((insn & 0x3e0) * 8 + 0xc10));
    (*pcVar5)(s_00,ret,ret_00);
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret_00 + (long)s_00));
    return;
  }
LAB_006b17a3:
  unallocated_encoding_aarch64(s);
  return;
}

Assistant:

static void disas_crypto_two_reg_sha512(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int opcode = extract32(insn, 10, 2);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    TCGv_ptr tcg_rd_ptr, tcg_rn_ptr;
    bool feature;
    CryptoTwoOpFn *genfn;

    switch (opcode) {
    case 0: /* SHA512SU0 */
        feature = dc_isar_feature(aa64_sha512, s);
        genfn = gen_helper_crypto_sha512su0;
        break;
    case 1: /* SM4E */
        feature = dc_isar_feature(aa64_sm4, s);
        genfn = gen_helper_crypto_sm4e;
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    if (!feature) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    tcg_rd_ptr = vec_full_reg_ptr(s, rd);
    tcg_rn_ptr = vec_full_reg_ptr(s, rn);

    genfn(tcg_ctx, tcg_rd_ptr, tcg_rn_ptr);

    tcg_temp_free_ptr(tcg_ctx, tcg_rd_ptr);
    tcg_temp_free_ptr(tcg_ctx, tcg_rn_ptr);
}